

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_know_alignment(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RCX;
  undefined4 in_R8D;
  int ap;
  char *msg;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffffc8;
  char *pcVar3;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = get_align(in_RCX);
  if (iVar2 < 1) {
    if (iVar2 == 0) {
      pcVar3 = "$N doesn\'t have a firm moral commitment.";
    }
    else {
      pcVar3 = "$N is the embodiment of pure evil!.";
    }
  }
  else {
    pcVar3 = "$N has a pure and good aura.";
  }
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,pcVar3,
      (void *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),0);
  bVar1 = is_npc((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  if (!bVar1) {
    iVar2 = get_ethos((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  }
  if (iVar2 < 1) {
    if (iVar2 == 0) {
      pcVar3 = "$N doesn\'t know what to think about the law";
    }
    else {
      pcVar3 = "$N has absolutely no cares for the law.";
    }
  }
  else {
    pcVar3 = "$N abides by the law of the land.";
  }
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,pcVar3,
      (void *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),0);
  return;
}

Assistant:

void spell_know_alignment(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	char *msg;
	int ap;

	ap = get_align(victim);

	if (ap > 0)
		msg = "$N has a pure and good aura.";
	else if (ap == 0)
		msg = "$N doesn't have a firm moral commitment.";
	else
		msg = "$N is the embodiment of pure evil!.";

	act(msg, ch, nullptr, victim, TO_CHAR);

	if (!is_npc(victim))
		ap = get_ethos(victim);

	if (ap > 0)
		msg = "$N abides by the law of the land.";
	else if (ap == 0)
		msg = "$N doesn't know what to think about the law";
	else
		msg = "$N has absolutely no cares for the law.";

	act(msg, ch, nullptr, victim, TO_CHAR);
	return;
}